

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m128i *palVar1;
  __m128i *palVar2;
  int *piVar3;
  uint *puVar4;
  __m128i *palVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  uint uVar20;
  int seglen;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  undefined8 extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  uint uVar24;
  char *__format;
  long lVar25;
  int iVar26;
  long lVar27;
  int32_t iVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar34;
  __m128i alVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  __m128i alVar42;
  uint uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  uint uVar49;
  undefined1 auVar46 [16];
  __m128i alVar47;
  __m128i alVar48;
  int iVar50;
  ulong uVar51;
  int iVar56;
  int iVar57;
  int iVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  long lVar58;
  __m128i alVar54;
  __m128i alVar55;
  uint uVar60;
  ulong uVar61;
  int iVar68;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar67;
  uint uVar69;
  int iVar71;
  uint uVar72;
  undefined1 auVar64 [16];
  long lVar70;
  __m128i alVar65;
  __m128i alVar66;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  int iVar80;
  uint uVar81;
  int iVar82;
  uint uVar84;
  undefined1 auVar83 [16];
  uint uVar85;
  uint uVar86;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  undefined1 auVar87 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar102;
  uint uVar103;
  uint uVar104;
  uint uVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  undefined1 in_XMM13 [16];
  int iVar109;
  int iVar110;
  int iVar112;
  int iVar113;
  undefined1 in_XMM14 [16];
  int iVar114;
  undefined1 auVar111 [16];
  undefined1 in_XMM15 [16];
  __m128i alVar115;
  __m128i alVar116;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  undefined1 local_208 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar23 = "profile->matrix";
      }
      else {
        uVar21 = profile->s1Len;
        if ((int)uVar21 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar23 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "open";
        }
        else {
          if (-1 < gap) {
            uVar24 = uVar21 - 1;
            uVar29 = (ulong)uVar21 + 3 >> 2;
            uVar32 = (ulong)uVar24 % uVar29;
            iVar26 = -open;
            iVar50 = ppVar7->min;
            uVar20 = 0x80000000 - iVar50;
            if (iVar50 != iVar26 && SBORROW4(iVar50,iVar26) == iVar50 + open < 0) {
              uVar20 = open | 0x80000000;
            }
            pvVar8 = (profile->profile32).matches;
            uVar14 = 0x7ffffffe - ppVar7->max;
            pvVar9 = (profile->profile32).similar;
            ppVar19 = parasail_result_new_rowcol3((uint)((ulong)uVar21 + 3) & 0x7ffffffc,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag = ppVar19->flag | 0x4450401;
              b = parasail_memalign___m128i(0x10,uVar29);
              b_00 = parasail_memalign___m128i(0x10,uVar29);
              b_01 = parasail_memalign___m128i(0x10,uVar29);
              b_02 = parasail_memalign___m128i(0x10,uVar29);
              ptr = parasail_memalign___m128i(0x10,uVar29);
              b_03 = parasail_memalign___m128i(0x10,uVar29);
              b_04 = parasail_memalign___m128i(0x10,uVar29);
              b_05 = parasail_memalign___m128i(0x10,uVar29);
              ptr_00 = parasail_memalign___m128i(0x10,uVar29);
              ptr_01 = parasail_memalign___m128i(0x10,uVar29);
              ptr_02 = parasail_memalign___m128i(0x10,uVar29);
              ptr_03 = parasail_memalign___m128i(0x10,uVar29);
              ptr_04 = parasail_memalign___m128i(0x10,uVar29);
              ptr_05 = parasail_memalign___m128i(0x10,uVar29);
              ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              alVar34[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar34[1]._0_1_ = ptr_00 == (__m128i *)0x0;
              auVar33._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar33._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar83._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar83._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar33 = packssdw(auVar33,auVar83);
              auVar45._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar45._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar62._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar62._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar45 = packssdw(auVar45,auVar62);
              auVar33 = packssdw(auVar33,auVar45);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (int32_t *)0x0) &&
                  ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar33 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar33[0xf])) {
                iVar15 = s2Len + -1;
                iVar16 = 3 - (int)(uVar24 / uVar29);
                uVar20 = uVar20 + 1;
                seglen = (int)uVar29;
                iVar17 = -(seglen * gap);
                alVar34[0] = uVar29;
                uVar22 = uVar29;
                parasail_memset___m128i(b_03,alVar34,uVar29);
                alVar115[1] = extraout_RDX_00;
                alVar115[0] = uVar29;
                parasail_memset___m128i(b_04,alVar115,uVar22);
                alVar116[1] = extraout_RDX_01;
                alVar116[0] = uVar29;
                parasail_memset___m128i(b_05,alVar116,uVar22);
                c[1] = extraout_RDX_02;
                c[0] = uVar29;
                parasail_memset___m128i(b,c,uVar22);
                c_00[1] = extraout_RDX_03;
                c_00[0] = uVar29;
                parasail_memset___m128i(b_00,c_00,uVar22);
                c_01[1] = extraout_RDX_04;
                c_01[0] = uVar29;
                parasail_memset___m128i(b_01,c_01,uVar22);
                c_02[1] = extraout_RDX_05;
                c_02[0] = uVar29;
                parasail_memset___m128i(b_02,c_02,uVar22);
                iVar50 = -open;
                iVar56 = -open;
                iVar57 = -open;
                iVar59 = -open;
                uVar18 = seglen - 1;
                alVar34 = (__m128i)pmovsxbd(extraout_XMM0,0x1010101);
                for (uVar21 = uVar18; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
                  palVar1 = ptr_04 + uVar21;
                  *(int *)*palVar1 = iVar50;
                  *(int *)((long)*palVar1 + 4) = iVar56;
                  *(int *)(*palVar1 + 1) = iVar57;
                  *(int *)((long)*palVar1 + 0xc) = iVar59;
                  ptr_05[uVar21] = alVar34;
                  iVar50 = iVar50 - gap;
                  iVar56 = iVar56 - gap;
                  iVar57 = iVar57 - gap;
                  iVar59 = iVar59 - gap;
                  alVar35[0]._0_4_ = (int)alVar34[0] + 1;
                  alVar35[0]._4_4_ = alVar34[0]._4_4_ + 1;
                  alVar35[1]._0_4_ = (int)alVar34[1] + 1;
                  alVar35[1]._4_4_ = alVar34[1]._4_4_ + 1;
                  alVar34 = alVar35;
                }
                iVar50 = iVar26;
                for (uVar22 = 0; uVar22 != uVar29; uVar22 = uVar22 + 1) {
                  iVar56 = iVar50;
                  for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
                    *(int *)((long)&h + lVar25 * 4) = iVar56;
                    iVar56 = iVar56 - seglen * gap;
                  }
                  ptr[uVar22][0] = h.m[0];
                  ptr[uVar22][1] = h.m[1];
                  iVar50 = iVar50 - gap;
                }
                *ptr_06 = 0;
                for (uVar22 = 1; s2Len + 1 != uVar22; uVar22 = uVar22 + 1) {
                  ptr_06[uVar22] = iVar26;
                  iVar26 = iVar26 - gap;
                }
                palVar5 = ptr + uVar18;
                palVar1 = b_03 + uVar18;
                palVar2 = b_04 + uVar18;
                uVar22 = 0;
                uVar21 = uVar20;
                uVar88 = uVar20;
                uVar90 = uVar20;
                uVar92 = uVar20;
                uVar102 = uVar14;
                uVar103 = uVar14;
                uVar104 = uVar14;
                uVar105 = uVar14;
                while (uVar22 != (uint)s2Len) {
                  iStack_104 = (int)(*palVar1)[0];
                  iStack_100 = *(int *)((long)*palVar1 + 4);
                  iStack_fc = (int)(*palVar1)[1];
                  iStack_54 = (int)(*palVar2)[0];
                  iStack_50 = *(int *)((long)*palVar2 + 4);
                  iStack_4c = (int)(*palVar2)[1];
                  uVar31 = b_05[uVar18][0];
                  local_108 = 0;
                  local_58 = 0;
                  auVar100._0_8_ = uVar31 << 0x20;
                  auVar100._8_8_ = b_05[uVar18][1] << 0x20 | uVar31 >> 0x20;
                  lVar27 = (long)(ppVar7->mapper[(byte)s2[uVar22]] * seglen) * 0x10;
                  uVar75 = uVar20 - (int)(*ptr_04)[0];
                  uVar77 = uVar20 - *(int *)((long)*ptr_04 + 4);
                  uVar79 = uVar20 - (int)(*ptr_04)[1];
                  uVar81 = uVar20 - *(int *)((long)*ptr_04 + 0xc);
                  local_1c8 = (undefined1  [16])0x0;
                  lVar25 = 0;
                  local_1d8 = (undefined1  [16])0x0;
                  auVar33 = (undefined1  [16])0x0;
                  iVar28 = ptr_06[uVar22];
                  iVar50 = (int)(*palVar5)[0];
                  iVar26 = *(int *)((long)*palVar5 + 4);
                  iVar56 = (int)(*palVar5)[1];
                  local_208 = in_XMM13;
                  local_1e8 = in_XMM14;
                  local_1b8 = in_XMM15;
                  local_178 = uVar20;
                  uStack_174 = uVar20;
                  uStack_170 = uVar20;
                  uStack_16c = uVar20;
                  while( true ) {
                    uVar11 = local_1b8._0_4_;
                    uVar12 = local_1b8._4_4_;
                    uVar13 = local_1b8._8_4_;
                    if (uVar29 << 4 == lVar25) break;
                    piVar3 = (int *)((long)*ptr + lVar25);
                    iVar57 = *piVar3;
                    iVar59 = piVar3[1];
                    iVar71 = piVar3[2];
                    iVar68 = piVar3[3];
                    auVar45 = *(undefined1 (*) [16])((long)*b_03 + lVar25);
                    auVar83 = *(undefined1 (*) [16])((long)*b_04 + lVar25);
                    piVar3 = (int *)((long)*b + lVar25);
                    iVar110 = iVar57 - open;
                    iVar112 = iVar59 - open;
                    iVar113 = iVar71 - open;
                    iVar114 = iVar68 - open;
                    iVar106 = *piVar3 - gap;
                    iVar107 = piVar3[1] - gap;
                    iVar108 = piVar3[2] - gap;
                    iVar109 = piVar3[3] - gap;
                    auVar36._0_4_ = -(uint)(iVar106 < iVar110);
                    auVar36._4_4_ = -(uint)(iVar107 < iVar112);
                    auVar36._8_4_ = -(uint)(iVar108 < iVar113);
                    auVar36._12_4_ = -(uint)(iVar109 < iVar114);
                    auVar52 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar45,auVar36)
                    ;
                    auVar63 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar83,auVar36)
                    ;
                    auVar62 = *(undefined1 (*) [16])((long)*b_05 + lVar25);
                    auVar94 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar62,auVar36)
                    ;
                    piVar3 = (int *)((long)*ptr_04 + lVar25);
                    iVar76 = uVar75 + *piVar3;
                    iVar78 = uVar77 + piVar3[1];
                    iVar80 = uVar79 + piVar3[2];
                    iVar82 = uVar81 + piVar3[3];
                    auVar37._0_4_ = -(uint)((int)local_178 < iVar76);
                    auVar37._4_4_ = -(uint)((int)uStack_174 < iVar78);
                    auVar37._8_4_ = -(uint)((int)uStack_170 < iVar80);
                    auVar37._12_4_ = -(uint)((int)uStack_16c < iVar82);
                    local_1c8 = blendvps(local_1c8,local_208,auVar37);
                    local_1d8 = blendvps(local_1d8,local_1e8,auVar37);
                    uVar75 = (uint)(iVar106 < iVar110) * iVar110 |
                             (uint)(iVar106 >= iVar110) * iVar106;
                    uVar77 = (uint)(iVar107 < iVar112) * iVar112 |
                             (uint)(iVar107 >= iVar112) * iVar107;
                    uVar79 = (uint)(iVar108 < iVar113) * iVar113 |
                             (uint)(iVar108 >= iVar113) * iVar108;
                    uVar81 = (uint)(iVar109 < iVar114) * iVar114 |
                             (uint)(iVar109 >= iVar114) * iVar109;
                    piVar3 = (int *)((long)*ptr_05 + lVar25);
                    auVar111._0_4_ = local_1b8._0_4_ + *piVar3;
                    auVar111._4_4_ = local_1b8._4_4_ + piVar3[1];
                    auVar111._8_4_ = local_1b8._8_4_ + piVar3[2];
                    auVar111._12_4_ = local_1b8._12_4_ + piVar3[3];
                    auVar33 = blendvps(auVar33,auVar111,auVar37);
                    piVar3 = (int *)((long)pvVar6 + lVar25 + lVar27);
                    iVar106 = iVar28 + *piVar3;
                    iVar50 = iVar50 + piVar3[1];
                    iVar26 = iVar26 + piVar3[2];
                    iVar56 = iVar56 + piVar3[3];
                    piVar3 = (int *)((long)pvVar8 + lVar25 + lVar27);
                    auVar73._0_4_ = local_108 + *piVar3;
                    auVar73._4_4_ = iStack_104 + piVar3[1];
                    auVar73._8_4_ = iStack_100 + piVar3[2];
                    auVar73._12_4_ = iStack_fc + piVar3[3];
                    piVar3 = (int *)((long)pvVar9 + lVar25 + lVar27);
                    auVar98._0_4_ = local_58 + *piVar3;
                    auVar98._4_4_ = iStack_54 + piVar3[1];
                    auVar98._8_4_ = iStack_50 + piVar3[2];
                    auVar98._12_4_ = iStack_4c + piVar3[3];
                    auVar38._0_4_ = -(uint)(iVar106 < (int)uVar75);
                    auVar38._4_4_ = -(uint)(iVar50 < (int)uVar77);
                    auVar38._8_4_ = -(uint)(iVar26 < (int)uVar79);
                    auVar38._12_4_ = -(uint)(iVar56 < (int)uVar81);
                    local_208 = blendvps(auVar73,auVar52,auVar38);
                    local_1e8 = blendvps(auVar98,auVar63,auVar38);
                    auVar95._0_4_ = auVar94._0_4_ + 1;
                    auVar95._4_4_ = auVar94._4_4_ + 1;
                    auVar95._8_4_ = auVar94._8_4_ + 1;
                    auVar95._12_4_ = auVar94._12_4_ + 1;
                    auVar101._0_4_ = auVar100._0_4_ + 1;
                    auVar101._4_4_ = auVar100._4_4_ + 1;
                    auVar101._8_4_ = auVar100._8_4_ + 1;
                    auVar101._12_4_ = auVar100._12_4_ + 1;
                    local_1b8 = blendvps(auVar101,auVar95,auVar38);
                    local_178 = (uint)((int)local_178 < iVar76) * iVar76 |
                                ((int)local_178 >= iVar76) * local_178;
                    uStack_174 = (uint)((int)uStack_174 < iVar78) * iVar78 |
                                 ((int)uStack_174 >= iVar78) * uStack_174;
                    uStack_170 = (uint)((int)uStack_170 < iVar80) * iVar80 |
                                 ((int)uStack_170 >= iVar80) * uStack_170;
                    uStack_16c = (uint)((int)uStack_16c < iVar82) * iVar82 |
                                 ((int)uStack_16c >= iVar82) * uStack_16c;
                    puVar4 = (uint *)((long)*b + lVar25);
                    *puVar4 = uVar75;
                    puVar4[1] = uVar77;
                    puVar4[2] = uVar79;
                    puVar4[3] = uVar81;
                    *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar52;
                    *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar63;
                    *(undefined1 (*) [16])((long)*b_02 + lVar25) = auVar95;
                    uVar75 = (uint)((int)uVar75 < iVar106) * iVar106 |
                             ((int)uVar75 >= iVar106) * uVar75;
                    uVar77 = (uint)((int)uVar77 < iVar50) * iVar50 |
                             ((int)uVar77 >= iVar50) * uVar77;
                    uVar79 = (uint)((int)uVar79 < iVar26) * iVar26 |
                             ((int)uVar79 >= iVar26) * uVar79;
                    uVar81 = (uint)((int)uVar81 < iVar56) * iVar56 |
                             ((int)uVar81 >= iVar56) * uVar81;
                    piVar3 = (int *)((long)*ptr + lVar25);
                    *piVar3 = iVar106;
                    piVar3[1] = iVar50;
                    piVar3[2] = iVar26;
                    piVar3[3] = iVar56;
                    *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar73;
                    *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar98;
                    *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar101;
                    lVar25 = lVar25 + 0x10;
                    local_108 = auVar45._0_4_;
                    iStack_104 = auVar45._4_4_;
                    iStack_100 = auVar45._8_4_;
                    iStack_fc = auVar45._12_4_;
                    local_58 = auVar83._0_4_;
                    iStack_54 = auVar83._4_4_;
                    iStack_50 = auVar83._8_4_;
                    iStack_4c = auVar83._12_4_;
                    auVar100 = auVar62;
                    iVar28 = iVar57;
                    iVar50 = iVar59;
                    iVar26 = iVar71;
                    iVar56 = iVar68;
                  }
                  in_XMM13._0_8_ = local_208._0_8_ << 0x20;
                  in_XMM13._8_8_ = local_208._8_8_ << 0x20 | (ulong)local_208._0_8_ >> 0x20;
                  in_XMM14._0_8_ = local_1e8._0_8_ << 0x20;
                  in_XMM14._8_8_ = local_1e8._8_8_ << 0x20 | (ulong)local_1e8._0_8_ >> 0x20;
                  in_XMM15._0_8_ = local_1b8._0_8_ << 0x20;
                  in_XMM15._8_8_ = local_1b8._8_8_ << 0x20 | (ulong)local_1b8._0_8_ >> 0x20;
                  iVar50 = ptr_06[uVar22 + 1];
                  iVar26 = (int)(*ptr_04)[0] + iVar50;
                  iVar56 = *(int *)((long)*ptr_04 + 4) + uVar75;
                  iVar57 = (int)(*ptr_04)[1] + uVar77;
                  iVar59 = *(int *)((long)*ptr_04 + 0xc) + uVar79;
                  auVar52._0_4_ = -(uint)(iVar26 < (int)local_178);
                  auVar52._4_4_ = -(uint)(iVar56 < (int)uStack_174);
                  auVar52._8_4_ = -(uint)(iVar57 < (int)uStack_170);
                  auVar52._12_4_ = -(uint)(iVar59 < (int)uStack_16c);
                  auVar63._0_4_ =
                       (iVar26 < (int)local_178) * local_178 |
                       (uint)(iVar26 >= (int)local_178) * iVar26;
                  auVar63._4_4_ =
                       (iVar56 < (int)uStack_174) * uStack_174 |
                       (uint)(iVar56 >= (int)uStack_174) * iVar56;
                  auVar63._8_4_ =
                       (iVar57 < (int)uStack_170) * uStack_170 |
                       (uint)(iVar57 >= (int)uStack_170) * iVar57;
                  auVar63._12_4_ =
                       (iVar59 < (int)uStack_16c) * uStack_16c |
                       (uint)(iVar59 >= (int)uStack_16c) * iVar59;
                  auVar45 = blendvps(in_XMM13,local_1c8,auVar52);
                  auVar83 = blendvps(in_XMM14,local_1d8,auVar52);
                  auVar94._4_4_ = *(int *)((long)*ptr_05 + 4) + uVar11;
                  auVar94._0_4_ = (int)(*ptr_05)[0];
                  auVar94._8_4_ = (int)(*ptr_05)[1] + uVar12;
                  auVar94._12_4_ = *(int *)((long)*ptr_05 + 0xc) + uVar13;
                  auVar33 = blendvps(auVar94,auVar33,auVar52);
                  iVar26 = 2;
                  while( true ) {
                    auVar96._0_8_ = auVar45._0_8_ << 0x20;
                    auVar96._8_8_ = auVar45._8_8_ << 0x20 | auVar45._0_8_ >> 0x20;
                    auVar97._0_8_ = auVar83._0_8_ << 0x20;
                    auVar97._8_8_ = auVar83._8_8_ << 0x20 | auVar83._0_8_ >> 0x20;
                    auVar99._0_8_ = auVar33._0_8_ << 0x20;
                    auVar99._8_8_ = auVar33._8_8_ << 0x20 | auVar33._0_8_ >> 0x20;
                    bVar30 = iVar26 == 0;
                    iVar26 = iVar26 + -1;
                    uVar81 = auVar63._0_4_;
                    uVar84 = auVar63._4_4_;
                    uVar85 = auVar63._8_4_;
                    if (bVar30) break;
                    iVar57 = uVar81 + iVar17;
                    iVar59 = uVar84 + iVar17;
                    iVar71 = uVar85 + iVar17;
                    auVar39._0_4_ = -(uint)((int)uVar20 < (int)uVar81);
                    auVar39._4_4_ = -(uint)(iVar57 < (int)uVar84);
                    iVar56 = auVar63._12_4_;
                    auVar39._8_4_ = -(uint)(iVar59 < (int)uVar85);
                    auVar39._12_4_ = -(uint)(iVar71 < iVar56);
                    auVar45 = blendvps(auVar96,auVar45,auVar39);
                    auVar83 = blendvps(auVar97,auVar83,auVar39);
                    auVar10._4_4_ = auVar33._4_4_ + seglen;
                    auVar10._0_4_ = auVar33._0_4_ + seglen;
                    auVar10._8_4_ = auVar33._8_4_ + seglen;
                    auVar10._12_4_ = 0;
                    auVar33 = blendvps(auVar10 << 0x20,auVar33,auVar39);
                    auVar63._0_4_ =
                         ((int)uVar81 < (int)uVar20) * uVar20 |
                         ((int)uVar81 >= (int)uVar20) * uVar81;
                    auVar63._4_4_ =
                         (uint)((int)uVar84 < iVar57) * iVar57 | ((int)uVar84 >= iVar57) * uVar84;
                    auVar63._8_4_ =
                         (uint)((int)uVar85 < iVar59) * iVar59 | ((int)uVar85 >= iVar59) * uVar85;
                    auVar63._12_4_ =
                         (uint)(iVar56 < iVar71) * iVar71 | (uint)(iVar56 >= iVar71) * iVar56;
                  }
                  auVar40._0_4_ = -(uint)(iVar50 < (int)uVar20);
                  auVar40._4_4_ = -(uint)((int)uVar75 < (int)uVar81);
                  auVar40._8_4_ = -(uint)((int)uVar77 < (int)uVar84);
                  auVar40._12_4_ = -(uint)((int)uVar79 < (int)uVar85);
                  uVar43 = (iVar50 < (int)uVar20) * uVar20 | (uint)(iVar50 >= (int)uVar20) * iVar50;
                  uVar49 = ((int)uVar75 < (int)uVar81) * uVar81 |
                           ((int)uVar75 >= (int)uVar81) * uVar75;
                  uVar77 = ((int)uVar77 < (int)uVar84) * uVar84 |
                           ((int)uVar77 >= (int)uVar84) * uVar77;
                  uVar79 = ((int)uVar79 < (int)uVar85) * uVar85 |
                           ((int)uVar79 >= (int)uVar85) * uVar79;
                  auVar83 = blendvps(in_XMM13,auVar96,auVar40);
                  auVar33 = blendvps(in_XMM14,auVar97,auVar40);
                  auVar45 = blendvps(in_XMM15,auVar99,auVar40);
                  uVar75 = uVar20;
                  for (lVar25 = 0; uVar29 << 4 != lVar25; lVar25 = lVar25 + 0x10) {
                    iVar50 = uVar43 - open;
                    iVar26 = uVar49 - open;
                    iVar56 = uVar77 - open;
                    iVar57 = uVar79 - open;
                    iVar59 = uVar75 - gap;
                    iVar71 = uVar81 - gap;
                    iVar68 = uVar84 - gap;
                    iVar76 = uVar85 - gap;
                    auVar46._0_4_ = -(uint)(iVar59 < iVar50);
                    auVar46._4_4_ = -(uint)(iVar71 < iVar26);
                    auVar46._8_4_ = -(uint)(iVar68 < iVar56);
                    auVar46._12_4_ = -(uint)(iVar76 < iVar57);
                    auVar96 = blendvps(auVar96,auVar83,auVar46);
                    auVar97 = blendvps(auVar97,auVar33,auVar46);
                    puVar4 = (uint *)((long)*ptr + lVar25);
                    uVar86 = *puVar4;
                    uVar89 = puVar4[1];
                    uVar91 = puVar4[2];
                    uVar93 = puVar4[3];
                    auVar33 = blendvps(auVar99,auVar45,auVar46);
                    uVar75 = (uint)(iVar50 < iVar59) * iVar59 | (uint)(iVar50 >= iVar59) * iVar50;
                    uVar81 = (uint)(iVar26 < iVar71) * iVar71 | (uint)(iVar26 >= iVar71) * iVar26;
                    uVar84 = (uint)(iVar56 < iVar68) * iVar68 | (uint)(iVar56 >= iVar68) * iVar56;
                    uVar85 = (uint)(iVar57 < iVar76) * iVar76 | (uint)(iVar57 >= iVar76) * iVar57;
                    piVar3 = (int *)((long)*b + lVar25);
                    iVar50 = *piVar3;
                    iVar26 = piVar3[1];
                    iVar56 = piVar3[2];
                    iVar57 = piVar3[3];
                    uVar60 = (iVar50 < (int)uVar86) * uVar86 |
                             (uint)(iVar50 >= (int)uVar86) * iVar50;
                    uVar67 = (iVar26 < (int)uVar89) * uVar89 |
                             (uint)(iVar26 >= (int)uVar89) * iVar26;
                    uVar69 = (iVar56 < (int)uVar91) * uVar91 |
                             (uint)(iVar56 >= (int)uVar91) * iVar56;
                    uVar72 = (iVar57 < (int)uVar93) * uVar93 |
                             (uint)(iVar57 >= (int)uVar93) * iVar57;
                    uVar43 = ((int)uVar60 < (int)uVar75) * uVar75 |
                             ((int)uVar60 >= (int)uVar75) * uVar60;
                    uVar49 = ((int)uVar67 < (int)uVar81) * uVar81 |
                             ((int)uVar67 >= (int)uVar81) * uVar67;
                    uVar77 = ((int)uVar69 < (int)uVar84) * uVar84 |
                             ((int)uVar69 >= (int)uVar84) * uVar69;
                    uVar79 = ((int)uVar72 < (int)uVar85) * uVar85 |
                             ((int)uVar72 >= (int)uVar85) * uVar72;
                    auVar53._0_4_ = -(uint)(uVar86 == uVar43);
                    auVar53._4_4_ = -(uint)(uVar89 == uVar49);
                    auVar53._8_4_ = -(uint)(uVar91 == uVar77);
                    auVar53._12_4_ = -(uint)(uVar93 == uVar79);
                    auVar64._0_4_ = -(uint)((int)uVar75 < (int)uVar60);
                    auVar64._4_4_ = -(uint)((int)uVar81 < (int)uVar67);
                    auVar64._8_4_ = -(uint)((int)uVar84 < (int)uVar69);
                    auVar64._12_4_ = -(uint)((int)uVar85 < (int)uVar72);
                    auVar45 = blendvps(auVar96,*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar64)
                    ;
                    auVar83 = blendvps(auVar45,*(undefined1 (*) [16])((long)*b_03 + lVar25),auVar53)
                    ;
                    auVar99._0_4_ = auVar33._0_4_ + 1;
                    auVar99._4_4_ = auVar33._4_4_ + 1;
                    auVar99._8_4_ = auVar33._8_4_ + 1;
                    auVar99._12_4_ = auVar33._12_4_ + 1;
                    auVar33 = blendvps(auVar97,*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar64)
                    ;
                    auVar33 = blendvps(auVar33,*(undefined1 (*) [16])((long)*b_04 + lVar25),auVar53)
                    ;
                    auVar45 = blendvps(auVar99,*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar64)
                    ;
                    auVar45 = blendvps(auVar45,*(undefined1 (*) [16])((long)*b_05 + lVar25),auVar53)
                    ;
                    puVar4 = (uint *)((long)*ptr + lVar25);
                    *puVar4 = uVar43;
                    puVar4[1] = uVar49;
                    puVar4[2] = uVar77;
                    puVar4[3] = uVar79;
                    *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar83;
                    *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar33;
                    *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar45;
                    uVar102 = ((int)uVar43 < (int)uVar102) * uVar43 |
                              ((int)uVar43 >= (int)uVar102) * uVar102;
                    uVar103 = ((int)uVar49 < (int)uVar103) * uVar49 |
                              ((int)uVar49 >= (int)uVar103) * uVar103;
                    uVar104 = ((int)uVar77 < (int)uVar104) * uVar77 |
                              ((int)uVar77 >= (int)uVar104) * uVar104;
                    uVar105 = ((int)uVar79 < (int)uVar105) * uVar79 |
                              ((int)uVar79 >= (int)uVar105) * uVar105;
                    uVar21 = ((int)uVar21 < (int)uVar43) * uVar43 |
                             ((int)uVar21 >= (int)uVar43) * uVar21;
                    uVar88 = ((int)uVar88 < (int)uVar49) * uVar49 |
                             ((int)uVar88 >= (int)uVar49) * uVar88;
                    uVar90 = ((int)uVar90 < (int)uVar77) * uVar77 |
                             ((int)uVar90 >= (int)uVar77) * uVar90;
                    uVar92 = ((int)uVar92 < (int)uVar79) * uVar79 |
                             ((int)uVar92 >= (int)uVar79) * uVar92;
                    iVar50 = auVar83._0_4_;
                    uVar86 = (uint)((int)uVar21 < iVar50) * iVar50 |
                             ((int)uVar21 >= iVar50) * uVar21;
                    iVar50 = auVar83._4_4_;
                    uVar89 = (uint)((int)uVar88 < iVar50) * iVar50 |
                             ((int)uVar88 >= iVar50) * uVar88;
                    iVar50 = auVar83._8_4_;
                    uVar91 = (uint)((int)uVar90 < iVar50) * iVar50 |
                             ((int)uVar90 >= iVar50) * uVar90;
                    iVar50 = auVar83._12_4_;
                    uVar93 = (uint)((int)uVar92 < iVar50) * iVar50 |
                             ((int)uVar92 >= iVar50) * uVar92;
                    iVar50 = auVar45._0_4_;
                    iVar26 = auVar33._0_4_;
                    uVar21 = (uint)(iVar26 < iVar50) * iVar50 | (uint)(iVar26 >= iVar50) * iVar26;
                    iVar50 = auVar45._4_4_;
                    iVar26 = auVar33._4_4_;
                    uVar88 = (uint)(iVar26 < iVar50) * iVar50 | (uint)(iVar26 >= iVar50) * iVar26;
                    iVar50 = auVar45._8_4_;
                    iVar26 = auVar33._8_4_;
                    iVar56 = auVar33._12_4_;
                    uVar90 = (uint)(iVar26 < iVar50) * iVar50 | (uint)(iVar26 >= iVar50) * iVar26;
                    iVar50 = auVar45._12_4_;
                    uVar92 = (uint)(iVar56 < iVar50) * iVar50 | (uint)(iVar56 >= iVar50) * iVar56;
                    uVar21 = ((int)uVar86 < (int)uVar21) * uVar21 |
                             ((int)uVar86 >= (int)uVar21) * uVar86;
                    uVar88 = ((int)uVar89 < (int)uVar88) * uVar88 |
                             ((int)uVar89 >= (int)uVar88) * uVar89;
                    uVar90 = ((int)uVar91 < (int)uVar90) * uVar90 |
                             ((int)uVar91 >= (int)uVar90) * uVar91;
                    uVar92 = ((int)uVar93 < (int)uVar92) * uVar92 |
                             ((int)uVar93 >= (int)uVar92) * uVar93;
                  }
                  alVar65 = ptr[uVar32];
                  alVar54 = b_03[uVar32];
                  alVar47 = b_04[uVar32];
                  alVar41 = b_05[uVar32];
                  iVar50 = 0;
                  while( true ) {
                    uVar61 = alVar65[0];
                    lVar70 = alVar65[1];
                    uVar51 = alVar54[0];
                    lVar58 = alVar54[1];
                    uVar44 = alVar47[0];
                    lVar27 = alVar47[1];
                    uVar31 = alVar41[0];
                    lVar25 = alVar41[1];
                    if (iVar16 <= iVar50) break;
                    alVar65[0] = uVar61 << 0x20;
                    alVar65[1] = lVar70 << 0x20 | uVar61 >> 0x20;
                    alVar54[0] = uVar51 << 0x20;
                    alVar54[1] = lVar58 << 0x20 | uVar51 >> 0x20;
                    alVar47[0] = uVar44 << 0x20;
                    alVar47[1] = lVar27 << 0x20 | uVar44 >> 0x20;
                    alVar41[0] = uVar31 << 0x20;
                    alVar41[1] = lVar25 << 0x20 | uVar31 >> 0x20;
                    iVar50 = iVar50 + 1;
                  }
                  *(int *)(*((ppVar19->field_4).trace)->trace_del_table + uVar22 * 4) =
                       alVar65[1]._4_4_;
                  *(int *)(*(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 8) +
                          uVar22 * 4) = alVar54[1]._4_4_;
                  *(int *)(*(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x10) +
                          uVar22 * 4) = alVar47[1]._4_4_;
                  *(int *)(*(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x18) +
                          uVar22 * 4) = alVar41[1]._4_4_;
                  uVar22 = uVar22 + 1;
                }
                lVar25 = 0;
                for (uVar22 = 0; uVar29 != uVar22; uVar22 = uVar22 + 1) {
                  alVar34 = *(__m128i *)((long)*b_03 + lVar25);
                  alVar115 = *(__m128i *)((long)*b_04 + lVar25);
                  alVar116 = *(__m128i *)((long)*b_05 + lVar25);
                  iVar28 = (int32_t)uVar22;
                  arr_store_col(*(int **)((long)((ppVar19->field_4).trace)->trace_del_table + 0x20),
                                *(__m128i *)((long)*ptr + lVar25),iVar28,seglen);
                  arr_store_col(*(int **)((long)((ppVar19->field_4).trace)->trace_del_table + 0x28),
                                alVar34,iVar28,seglen);
                  arr_store_col(*(int **)((long)((ppVar19->field_4).trace)->trace_del_table + 0x30),
                                alVar115,iVar28,seglen);
                  arr_store_col(*(int **)((long)((ppVar19->field_4).trace)->trace_del_table + 0x38),
                                alVar116,iVar28,seglen);
                  lVar25 = lVar25 + 0x10;
                }
                alVar42 = ptr[uVar32];
                alVar48 = b_03[uVar32];
                alVar55 = b_04[uVar32];
                alVar66 = b_05[uVar32];
                iVar50 = 0;
                while( true ) {
                  uVar32 = alVar42[0];
                  lVar25 = alVar42[1];
                  uVar29 = alVar48[0];
                  lVar27 = alVar48[1];
                  uVar22 = alVar55[0];
                  lVar58 = alVar55[1];
                  uVar31 = alVar66[0];
                  lVar70 = alVar66[1];
                  if (iVar16 <= iVar50) break;
                  alVar42[0] = uVar32 << 0x20;
                  alVar42[1] = lVar25 << 0x20 | uVar32 >> 0x20;
                  alVar48[0] = uVar29 << 0x20;
                  alVar48[1] = lVar27 << 0x20 | uVar29 >> 0x20;
                  alVar55[0] = uVar22 << 0x20;
                  alVar55[1] = lVar58 << 0x20 | uVar22 >> 0x20;
                  alVar66[0] = uVar31 << 0x20;
                  alVar66[1] = lVar70 << 0x20 | uVar31 >> 0x20;
                  iVar50 = iVar50 + 1;
                }
                auVar74._0_4_ = -(uint)((int)uVar102 < (int)uVar20);
                auVar74._4_4_ = -(uint)((int)uVar103 < (int)uVar20);
                auVar74._8_4_ = -(uint)((int)uVar104 < (int)uVar20);
                auVar74._12_4_ = -(uint)((int)uVar105 < (int)uVar20);
                auVar87._0_4_ = -(uint)((int)uVar14 < (int)uVar21);
                auVar87._4_4_ = -(uint)((int)uVar14 < (int)uVar88);
                auVar87._8_4_ = -(uint)((int)uVar14 < (int)uVar90);
                auVar87._12_4_ = -(uint)((int)uVar14 < (int)uVar92);
                iVar50 = movmskps(iVar50,auVar87 | auVar74);
                if (iVar50 == 0) {
                  iVar50 = alVar42[1]._4_4_;
                  iVar26 = alVar48[1]._4_4_;
                  iVar56 = alVar55[1]._4_4_;
                  iVar57 = alVar66[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                  iVar50 = 0;
                  iVar26 = 0;
                  iVar56 = 0;
                  iVar57 = 0;
                  iVar15 = 0;
                  uVar24 = 0;
                }
                ppVar19->score = iVar50;
                ppVar19->end_query = uVar24;
                ppVar19->end_ref = iVar15;
                ((ppVar19->field_4).stats)->matches = iVar26;
                ((ppVar19->field_4).stats)->similar = iVar56;
                ((ppVar19->field_4).stats)->length = iVar57;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar19;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_rowcol_scan_profile_sse41_128_32",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}